

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O1

void duckdb::Node::Free(ART *art,Node *node)

{
  ulong uVar1;
  NType NVar2;
  byte bVar3;
  type paVar4;
  
  uVar1 = (node->super_IndexPointer).data;
  if (uVar1 >> 0x38 != 0) {
    NVar2 = (NType)(uVar1 >> 0x38);
    switch(NVar2 & 0x7f) {
    case PREFIX:
      Prefix::Free(art,node);
      return;
    case LEAF:
      Leaf::DeprecatedFree(art,node);
      return;
    case NODE_4:
      BaseNode<(unsigned_char)'\x04',_(duckdb::NType)3>::Free(art,node);
      break;
    case NODE_16:
      BaseNode<(unsigned_char)'\x10',_(duckdb::NType)4>::Free(art,node);
      break;
    case NODE_48:
      Node48::Free(art,node);
      break;
    case NODE_256:
      Node256::Free(art,node);
      break;
    case LEAF_INLINED:
      goto switchD_0170b155_caseD_7;
    }
    paVar4 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
             ::operator*(&art->allocators);
    bVar3 = GetAllocatorIdx(NVar2 & 0x7f);
    FixedSizeAllocator::Free
              ((FixedSizeAllocator *)
               paVar4->_M_elems[bVar3].
               super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
               .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>,
               (IndexPointer)(node->super_IndexPointer).data);
  }
switchD_0170b155_caseD_7:
  (node->super_IndexPointer).data = 0;
  return;
}

Assistant:

void Node::Free(ART &art, Node &node) {
	if (!node.HasMetadata()) {
		return node.Clear();
	}

	// Free the children.
	auto type = node.GetType();
	switch (type) {
	case NType::PREFIX:
		return Prefix::Free(art, node);
	case NType::LEAF:
		return Leaf::DeprecatedFree(art, node);
	case NType::NODE_4:
		Node4::Free(art, node);
		break;
	case NType::NODE_16:
		Node16::Free(art, node);
		break;
	case NType::NODE_48:
		Node48::Free(art, node);
		break;
	case NType::NODE_256:
		Node256::Free(art, node);
		break;
	case NType::LEAF_INLINED:
		return node.Clear();
	case NType::NODE_7_LEAF:
	case NType::NODE_15_LEAF:
	case NType::NODE_256_LEAF:
		break;
	}

	GetAllocator(art, type).Free(node);
	node.Clear();
}